

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

int Tim_ManBlackBoxNum(Tim_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  long lVar3;
  
  pVVar1 = p->vBoxes;
  iVar2 = 0;
  if ((pVVar1 != (Vec_Ptr_t *)0x0) && (iVar2 = 0, 0 < (long)pVVar1->nSize)) {
    lVar3 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + *(int *)((long)pVVar1->pArray[lVar3] + 0x18);
      lVar3 = lVar3 + 1;
    } while (pVVar1->nSize != lVar3);
  }
  return iVar2;
}

Assistant:

int Tim_ManBlackBoxNum( Tim_Man_t * p )
{
    Tim_Box_t * pBox;
    int i, Counter = 0;
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
            Counter += pBox->fBlack;
    return Counter;
}